

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O2

void fld_import(limb_t *dst,uint8_t *src)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    for (; iVar3 < 0x33; iVar3 = iVar3 + 8) {
      bVar1 = *src;
      src = src + 1;
      uVar4 = uVar4 | (ulong)bVar1 << ((byte)iVar3 & 0x3f);
    }
    dst[lVar2] = uVar4 & 0x7ffffffffffff;
    uVar4 = uVar4 >> 0x33;
    iVar3 = iVar3 + -0x33;
  }
  *dst = *dst + uVar4 * 0x13;
  return;
}

Assistant:

void
fld_import(fld_t dst, const uint8_t src[32])
{
	int i;
	uint64_t tmp = 0;
	int fill = 0;

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		for (;fill < FLD_LIMB_BITS; fill += 8)
			tmp |= (uint64_t)*src++ << fill;

		dst[i] = tmp & FLD_LIMB_MASK;
		tmp >>= FLD_LIMB_BITS;
		fill -= FLD_LIMB_BITS;
	}
	dst[0] += 19*tmp;

	/* dst is now reduced and partially carried (first limb may
	 * use 52bits instead of 51).
	 */
}